

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O0

QFont * __thiscall QGraphicsWidgetPrivate::naturalWidgetFont(QGraphicsWidgetPrivate *this)

{
  QGraphicsWidget *pQVar1;
  QGraphicsWidgetPrivate *in_RSI;
  QFont *in_RDI;
  long in_FS_OFFSET;
  QGraphicsWidget *parent;
  QGraphicsWidget *q;
  QFont *naturalFont;
  QFont *this_00;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar2;
  QFont local_28 [16];
  QFont local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar1 = q_func(in_RSI);
  uVar2 = 0;
  *(undefined1 **)this_00 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)(this_00 + 8) = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont(this_00);
  pQVar1 = QGraphicsItem::parentWidget((QGraphicsItem *)pQVar1);
  if (pQVar1 == (QGraphicsWidget *)0x0) {
    if ((in_RSI->super_QGraphicsItemPrivate).scene != (QGraphicsScene *)0x0) {
      QGraphicsScene::font((QGraphicsScene *)this_00);
      QFont::operator=((QFont *)in_RSI,in_RDI);
      QFont::~QFont(local_28);
    }
  }
  else {
    QGraphicsWidget::font((QGraphicsWidget *)CONCAT17(uVar2,in_stack_ffffffffffffffb8));
    QFont::operator=((QFont *)in_RSI,in_RDI);
    QFont::~QFont(local_18);
  }
  QFont::setResolveMask(this_00,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QFont QGraphicsWidgetPrivate::naturalWidgetFont() const
{
    Q_Q(const QGraphicsWidget);
    QFont naturalFont; // ### no application font support
    if (QGraphicsWidget *parent = q->parentWidget()) {
        naturalFont = parent->font();
    } else if (scene) {
        naturalFont = scene->font();
    }
    naturalFont.setResolveMask(0);
    return naturalFont;
}